

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O1

uint parse_unsigned(char *valname,char *prog)

{
  bool bVar1;
  char *__nptr;
  int *piVar2;
  ulong uVar3;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  char *local_38;
  
  __nptr = _optarg;
  local_38 = (char *)0x0;
  piVar2 = __errno_location();
  *piVar2 = 0;
  uVar3 = strtoul(__nptr,&local_38,10);
  if ((((*piVar2 == 0x22 && uVar3 == 0xffffffffffffffff) || (*piVar2 != 0 && uVar3 == 0)) ||
      (local_38 == __nptr)) || (*local_38 != '\0')) {
    parse_unsigned_cold_2();
    uVar3 = extraout_RAX;
  }
  else {
    if (uVar3 >> 0x20 == 0) {
      bVar1 = true;
      goto LAB_00101bc6;
    }
    parse_unsigned_cold_1();
    uVar3 = extraout_RAX_00;
  }
  bVar1 = false;
LAB_00101bc6:
  if (bVar1) {
    return (uint)uVar3;
  }
  parse_unsigned_cold_3();
  fputs(valname,_stderr);
  printf("usage: %s -d <dir> [-p <pool_size>] [-e <extent_size>] [-v <val_max_factor>] [-t <timeout_seconds>] [-m <timeout_minutes>] [-o <timeout_hours>] [-s <seed_for_rand>] [-n] [-h]\n\t n  -  do not print out csv output (it is printed by default)\n"
         ,prog);
  exit(1);
}

Assistant:

static unsigned
parse_unsigned(const char *valname, const char *prog)
{
	unsigned val;
	if (str_to_unsigned(optarg, &val) != 0) {
		fprintf(stderr, "invalid %s value\n", valname);
		printf(usage_str, prog);
		exit(1);
	}
	return val;
}